

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_node ** lys_child(lys_node *node,LYS_NODE nodetype)

{
  LY_STMT stmt;
  lys_node **pplVar1;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x1005,"struct lys_node **lys_child(const struct lys_node *, LYS_NODE)");
  }
  if (node->nodetype == LYS_EXT) {
    stmt = lys_snode2stmt(nodetype);
    pplVar1 = (lys_node **)
              lys_ext_complex_get_substmt
                        (stmt,(lys_ext_instance_complex *)node,(lyext_substmt **)0x0);
    return pplVar1;
  }
  pplVar1 = (lys_node **)0x0;
  if ((node->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    pplVar1 = &node->child;
  }
  return pplVar1;
}

Assistant:

struct lys_node **
lys_child(const struct lys_node *node, LYS_NODE nodetype)
{
    void *pp;
    assert(node);

    if (node->nodetype == LYS_EXT) {
        pp = lys_ext_complex_get_substmt(lys_snode2stmt(nodetype), (struct lys_ext_instance_complex*)node, NULL);
        if (!pp) {
            return NULL;
        }
        return (struct lys_node **)pp;
    } else if (node->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
        return NULL;
    } else {
        return (struct lys_node **)&node->child;
    }
}